

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

int EstimateStripByteCounts(TIFF *tif,TIFFDirEntry *dir,uint16_t dircount)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint64_t *puVar6;
  uint64_t uVar7;
  toff_t tVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint16_t *puVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar5 = _TIFFFillStrilesInternal(tif,0);
  iVar11 = -1;
  if (iVar5 != 0) {
    puVar6 = (tif->tif_dir).td_stripbytecount_p;
    if (puVar6 != (uint64_t *)0x0) {
      _TIFFfreeExt(tif,puVar6);
    }
    puVar6 = (uint64_t *)
             _TIFFCheckMalloc(tif,(ulong)(tif->tif_dir).td_nstrips,8,"for \"StripByteCounts\" array"
                             );
    (tif->tif_dir).td_stripbytecount_p = puVar6;
    if (puVar6 != (uint64_t *)0x0) {
      if ((tif->tif_dir).td_compression == 1) {
        if ((tif->tif_flags & 0x400) == 0) {
          uVar7 = TIFFScanlineSize64(tif);
          uVar15 = (ulong)(tif->tif_dir).td_nstrips;
          if (uVar15 != 0) {
            uVar12 = (ulong)(tif->tif_dir).td_imagelength / (ulong)(tif->tif_dir).td_stripsperimage;
            uVar13 = 0;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar7;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = uVar12;
            do {
              if (SUB168(auVar2 * auVar4,8) != 0) {
                return -1;
              }
              (tif->tif_dir).td_stripbytecount_p[uVar13] = uVar7 * uVar12;
              uVar13 = uVar13 + 1;
            } while (uVar15 != uVar13);
          }
        }
        else {
          uVar7 = TIFFTileSize64(tif);
          auVar3 = _DAT_002ef930;
          uVar15 = (ulong)(tif->tif_dir).td_nstrips;
          if (uVar15 != 0) {
            puVar6 = (tif->tif_dir).td_stripbytecount_p;
            lVar14 = uVar15 - 1;
            auVar18._8_4_ = (int)lVar14;
            auVar18._0_8_ = lVar14;
            auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
            uVar12 = 0;
            auVar18 = auVar18 ^ _DAT_002ef930;
            auVar19 = _DAT_002f57d0;
            do {
              auVar20 = auVar19 ^ auVar3;
              if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                          auVar18._4_4_ < auVar20._4_4_) & 1)) {
                *(uint64_t *)((long)puVar6 + uVar12) = uVar7;
              }
              if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
                  auVar20._12_4_ <= auVar18._12_4_) {
                *(uint64_t *)((long)puVar6 + uVar12 + 8) = uVar7;
              }
              lVar14 = auVar19._8_8_;
              auVar19._0_8_ = auVar19._0_8_ + 2;
              auVar19._8_8_ = lVar14 + 2;
              uVar12 = uVar12 + 0x10;
            } while ((uVar15 * 8 + 8 & 0xfffffffffffffff0) != uVar12);
          }
        }
      }
      else {
        tVar8 = (*tif->tif_sizeproc)(tif->tif_clientdata);
        uVar9 = tif->tif_flags & 0x80000;
        lVar14 = ((ulong)(uVar9 >> 0x10) + 0xc) * (ulong)dircount;
        uVar15 = lVar14 + 0xe;
        if (uVar9 != 0) {
          uVar15 = lVar14 + 0x20;
        }
        if (dircount != 0) {
          puVar16 = &dir->tdir_type;
          do {
            uVar9 = TIFFDataWidth((uint)*puVar16);
            if (uVar9 == 0) {
              TIFFErrorExtR(tif,"EstimateStripByteCounts",
                            "Cannot determine size of unknown tag type %u",(ulong)*puVar16);
              return -1;
            }
            auVar3._8_8_ = 0;
            auVar3._0_8_ = CONCAT44(0,uVar9);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = *(ulong *)(puVar16 + 3);
            if (SUB168(auVar3 * auVar20,8) != 0) {
              return -1;
            }
            uVar13 = *(ulong *)(puVar16 + 3) * CONCAT44(0,uVar9);
            uVar12 = 0;
            if (8 < uVar13) {
              uVar12 = uVar13;
            }
            uVar10 = 0;
            if (4 < uVar13) {
              uVar10 = uVar13;
            }
            if ((tif->tif_flags & 0x80000) == 0) {
              uVar12 = uVar10;
            }
            bVar17 = CARRY8(uVar15,uVar12);
            uVar15 = uVar15 + uVar12;
            if (bVar17) {
              return -1;
            }
            puVar16 = puVar16 + 0x10;
            dircount = dircount - 1;
          } while (dircount != 0);
        }
        uVar12 = 0;
        if (uVar15 <= tVar8) {
          uVar12 = uVar15;
        }
        uVar12 = tVar8 - uVar12;
        if ((tif->tif_dir).td_planarconfig == 2) {
          uVar12 = uVar12 / (tif->tif_dir).td_samplesperpixel;
        }
        uVar15 = (ulong)(tif->tif_dir).td_nstrips;
        puVar6 = (tif->tif_dir).td_stripbytecount_p;
        if (uVar15 == 0) {
          lVar14 = 0xffffffff;
        }
        else {
          lVar14 = -1;
          do {
            puVar6[lVar14 + 1] = uVar12;
            lVar1 = lVar14 - uVar15;
            lVar14 = lVar14 + 1;
          } while (lVar1 != -2);
        }
        uVar15 = (tif->tif_dir).td_stripoffset_p[lVar14];
        if (CARRY8(puVar6[lVar14],uVar15)) {
          return -1;
        }
        if (tVar8 < puVar6[lVar14] + uVar15) {
          uVar7 = 0;
          if (uVar15 <= tVar8) {
            uVar7 = tVar8 - uVar15;
          }
          puVar6[lVar14] = uVar7;
        }
      }
      uVar9 = (tif->tif_dir).td_fieldsset[0];
      (tif->tif_dir).td_fieldsset[0] = uVar9 | 0x1000000;
      iVar11 = 1;
      if ((uVar9 >> 0x11 & 1) == 0) {
        (tif->tif_dir).td_rowsperstrip = (tif->tif_dir).td_imagelength;
      }
    }
  }
  return iVar11;
}

Assistant:

static int EstimateStripByteCounts(TIFF *tif, TIFFDirEntry *dir,
                                   uint16_t dircount)
{
    static const char module[] = "EstimateStripByteCounts";

    TIFFDirEntry *dp;
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t strip;

    /* Do not try to load stripbytecount as we will compute it */
    if (!_TIFFFillStrilesInternal(tif, 0))
        return -1;

    if (td->td_stripbytecount_p)
        _TIFFfreeExt(tif, td->td_stripbytecount_p);
    td->td_stripbytecount_p = (uint64_t *)_TIFFCheckMalloc(
        tif, td->td_nstrips, sizeof(uint64_t), "for \"StripByteCounts\" array");
    if (td->td_stripbytecount_p == NULL)
        return -1;

    if (td->td_compression != COMPRESSION_NONE)
    {
        uint64_t space;
        uint64_t filesize;
        uint16_t n;
        filesize = TIFFGetFileSize(tif);
        if (!(tif->tif_flags & TIFF_BIGTIFF))
            space = sizeof(TIFFHeaderClassic) + 2 + dircount * 12 + 4;
        else
            space = sizeof(TIFFHeaderBig) + 8 + dircount * 20 + 8;
        /* calculate amount of space used by indirect values */
        for (dp = dir, n = dircount; n > 0; n--, dp++)
        {
            uint32_t typewidth;
            uint64_t datasize;
            typewidth = TIFFDataWidth((TIFFDataType)dp->tdir_type);
            if (typewidth == 0)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Cannot determine size of unknown tag type %" PRIu16,
                    dp->tdir_type);
                return -1;
            }
            if (dp->tdir_count > UINT64_MAX / typewidth)
                return -1;
            datasize = (uint64_t)typewidth * dp->tdir_count;
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                if (datasize <= 4)
                    datasize = 0;
            }
            else
            {
                if (datasize <= 8)
                    datasize = 0;
            }
            if (space > UINT64_MAX - datasize)
                return -1;
            space += datasize;
        }
        if (filesize < space)
            /* we should perhaps return in error ? */
            space = filesize;
        else
            space = filesize - space;
        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
            space /= td->td_samplesperpixel;
        for (strip = 0; strip < td->td_nstrips; strip++)
            td->td_stripbytecount_p[strip] = space;
        /*
         * This gross hack handles the case were the offset to
         * the last strip is past the place where we think the strip
         * should begin.  Since a strip of data must be contiguous,
         * it's safe to assume that we've overestimated the amount
         * of data in the strip and trim this number back accordingly.
         */
        strip--;
        if (td->td_stripoffset_p[strip] >
            UINT64_MAX - td->td_stripbytecount_p[strip])
            return -1;
        if (td->td_stripoffset_p[strip] + td->td_stripbytecount_p[strip] >
            filesize)
        {
            if (td->td_stripoffset_p[strip] >= filesize)
            {
                /* Not sure what we should in that case... */
                td->td_stripbytecount_p[strip] = 0;
            }
            else
            {
                td->td_stripbytecount_p[strip] =
                    filesize - td->td_stripoffset_p[strip];
            }
        }
    }
    else if (isTiled(tif))
    {
        uint64_t bytespertile = TIFFTileSize64(tif);

        for (strip = 0; strip < td->td_nstrips; strip++)
            td->td_stripbytecount_p[strip] = bytespertile;
    }
    else
    {
        uint64_t rowbytes = TIFFScanlineSize64(tif);
        uint32_t rowsperstrip = td->td_imagelength / td->td_stripsperimage;
        for (strip = 0; strip < td->td_nstrips; strip++)
        {
            if (rowbytes > 0 && rowsperstrip > UINT64_MAX / rowbytes)
                return -1;
            td->td_stripbytecount_p[strip] = rowbytes * rowsperstrip;
        }
    }
    TIFFSetFieldBit(tif, FIELD_STRIPBYTECOUNTS);
    if (!TIFFFieldSet(tif, FIELD_ROWSPERSTRIP))
        td->td_rowsperstrip = td->td_imagelength;
    return 1;
}